

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O2

int32_t characterIteratorGetIndex(UCharIterator *iter,UCharIteratorOrigin origin)

{
  switch(origin) {
  case UITER_START:
    return *(int32_t *)((long)iter->context + 0x10);
  case UITER_CURRENT:
    return *(int32_t *)((long)iter->context + 0xc);
  case UITER_LIMIT:
    return *(int32_t *)((long)iter->context + 0x14);
  case UITER_ZERO:
    return 0;
  case UITER_LENGTH:
    return *(int32_t *)((long)iter->context + 8);
  default:
    return -1;
  }
}

Assistant:

static int32_t U_CALLCONV
characterIteratorGetIndex(UCharIterator *iter, UCharIteratorOrigin origin) {
    switch(origin) {
    case UITER_ZERO:
        return 0;
    case UITER_START:
        return ((CharacterIterator *)(iter->context))->startIndex();
    case UITER_CURRENT:
        return ((CharacterIterator *)(iter->context))->getIndex();
    case UITER_LIMIT:
        return ((CharacterIterator *)(iter->context))->endIndex();
    case UITER_LENGTH:
        return ((CharacterIterator *)(iter->context))->getLength();
    default:
        /* not a valid origin */
        /* Should never get here! */
        return -1;
    }
}